

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * embree::FileName::executableFolder(void)

{
  FileName *in_RDI;
  FileName local_50;
  string local_30;
  
  getExecutableFileName_abi_cxx11_();
  FileName(&local_50,&local_30);
  path(in_RDI,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

FileName FileName::executableFolder() {
    return FileName(getExecutableFileName()).path();
  }